

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementVector
          (DiscreteKalmanFilterHelper *this,VectorDynSize *y)

{
  long lVar1;
  VectorDynSize *in_RSI;
  long in_RDI;
  bool bVar2;
  
  lVar1 = iDynTree::VectorDynSize::size();
  bVar2 = lVar1 == *(long *)(in_RDI + 8);
  if (bVar2) {
    iDynTree::VectorDynSize::operator=((VectorDynSize *)(in_RDI + 0x78),in_RSI);
    *(undefined1 *)(in_RDI + 0x1de) = 1;
  }
  else {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfSetInitialState",
               "Could not set measurement - dimension mismatch");
  }
  return bVar2;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementVector(const iDynTree::VectorDynSize& y)
{
    if (y.size() != m_dim_Y)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetInitialState", "Could not set measurement - dimension mismatch");
        return false;
    }

    m_y = y;
    m_measurement_updated = true;
    return true;
}